

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3ExprBalance(Fts3Expr **pp,int nMaxDepth)

{
  sqlite3_uint64 n;
  int iVar1;
  int iVar2;
  void *__s;
  long lVar3;
  ulong uVar4;
  Fts3Expr *pFVar5;
  Fts3Expr **ppFVar6;
  Fts3Expr *pFVar7;
  Fts3Expr *pFVar8;
  ulong uVar9;
  undefined4 in_register_00000034;
  Fts3Expr *pFVar10;
  Fts3Expr *pFVar11;
  Fts3Expr *pLeft;
  ulong local_58;
  Fts3Expr *local_50;
  int local_44;
  Fts3Expr **local_40;
  Fts3Expr *pRight;
  
  pFVar11 = *pp;
  if (nMaxDepth == 0) {
    iVar2 = 1;
  }
  else {
    iVar1 = pFVar11->eType;
    local_58 = CONCAT44(in_register_00000034,nMaxDepth);
    if (1 < iVar1 - 3U) {
      if (iVar1 == 2) {
        pLeft = pFVar11->pLeft;
        pFVar8 = pFVar11->pRight;
        pFVar11->pLeft = (Fts3Expr *)0x0;
        pFVar11->pRight = (Fts3Expr *)0x0;
        pLeft->pParent = (Fts3Expr *)0x0;
        pFVar8->pParent = (Fts3Expr *)0x0;
        pRight = pFVar8;
        iVar2 = fts3ExprBalance(&pLeft,nMaxDepth + -1);
        if ((iVar2 == 0) &&
           (iVar2 = fts3ExprBalance(&pRight,nMaxDepth + -1), pFVar8 = pRight, iVar2 == 0)) {
          pFVar11->pLeft = pLeft;
          pLeft->pParent = pFVar11;
          pFVar11->pRight = pRight;
          pRight->pParent = pFVar11;
          iVar2 = 0;
        }
        else {
          sqlite3Fts3ExprFree(pFVar8);
          sqlite3Fts3ExprFree(pLeft);
        }
        goto LAB_001a5b10;
      }
      goto LAB_001a5b21;
    }
    n = (long)nMaxDepth * 8;
    local_50 = pFVar11;
    __s = sqlite3_malloc64(n);
    if (__s != (void *)0x0) {
      memset(__s,0,n);
      for (pLeft = local_50; pLeft->eType == iVar1; pLeft = pLeft->pLeft) {
      }
      local_44 = (int)local_58 + -1;
      pFVar8 = (Fts3Expr *)0x0;
      local_40 = pp;
      do {
        pFVar11 = pLeft->pParent;
        pLeft->pParent = (Fts3Expr *)0x0;
        if (pFVar11 == (Fts3Expr *)0x0) {
          local_50 = (Fts3Expr *)0x0;
        }
        else {
          pFVar11->pLeft = (Fts3Expr *)0x0;
        }
        iVar2 = fts3ExprBalance(&pLeft,local_44);
        if (iVar2 != 0) {
LAB_001a5a76:
          pFVar11 = local_50;
          uVar9 = 0;
          uVar4 = local_58 & 0xffffffff;
          if ((int)local_58 < 1) {
            uVar4 = 0;
          }
          for (; pp = local_40, uVar4 != uVar9; uVar9 = uVar9 + 1) {
            sqlite3Fts3ExprFree(*(Fts3Expr **)((long)__s + uVar9 * 8));
          }
          while (pFVar8 != (Fts3Expr *)0x0) {
            pFVar10 = pFVar8->pParent;
            sqlite3_free(pFVar8);
            pFVar8 = pFVar10;
          }
          goto LAB_001a5b08;
        }
        pFVar10 = pLeft;
        for (lVar3 = 0; (pFVar10 != (Fts3Expr *)0x0 && (lVar3 < nMaxDepth)); lVar3 = lVar3 + 1) {
          pFVar5 = *(Fts3Expr **)((long)__s + lVar3 * 8);
          if (pFVar5 == (Fts3Expr *)0x0) {
            pFVar5 = (Fts3Expr *)0x0;
          }
          else {
            pFVar8->pLeft = pFVar5;
            pFVar8->pRight = pFVar10;
            pFVar5->pParent = pFVar8;
            pFVar10->pParent = pFVar8;
            pFVar7 = pFVar8->pParent;
            pFVar8->pParent = (Fts3Expr *)0x0;
            pFVar10 = (Fts3Expr *)0x0;
            pFVar5 = pFVar8;
            pFVar8 = pFVar7;
          }
          *(Fts3Expr **)((long)__s + lVar3 * 8) = pFVar10;
          pFVar10 = pFVar5;
        }
        if (pFVar10 != (Fts3Expr *)0x0) {
          sqlite3Fts3ExprFree(pFVar10);
          iVar2 = 0x12;
          goto LAB_001a5a76;
        }
        if (pFVar11 == (Fts3Expr *)0x0) goto LAB_001a5ab7;
        ppFVar6 = &pFVar11->pRight;
        do {
          pLeft = *ppFVar6;
          ppFVar6 = &pLeft->pLeft;
        } while (pLeft->eType == iVar1);
        pFVar10 = pFVar11->pParent;
        pFVar5 = pFVar11->pRight;
        pFVar5->pParent = pFVar10;
        if (pFVar10 != (Fts3Expr *)0x0) {
          pFVar10->pLeft = pFVar5;
          pFVar5 = local_50;
        }
        local_50 = pFVar5;
        pFVar11->pParent = pFVar8;
        pFVar8 = pFVar11;
      } while( true );
    }
    iVar2 = 7;
    pFVar11 = local_50;
  }
  goto LAB_001a5b14;
LAB_001a5ab7:
  iVar2 = 0;
  uVar9 = local_58 & 0xffffffff;
  if ((int)local_58 < 1) {
    uVar9 = 0;
  }
  pFVar11 = (Fts3Expr *)0x0;
  for (uVar4 = 0; pp = local_40, uVar9 != uVar4; uVar4 = uVar4 + 1) {
    pFVar10 = *(Fts3Expr **)((long)__s + uVar4 * 8);
    pFVar5 = pFVar8;
    pFVar7 = pFVar11;
    if (pFVar10 != (Fts3Expr *)0x0) {
      pFVar7 = pFVar10;
      if (pFVar11 != (Fts3Expr *)0x0) {
        pFVar8->pRight = pFVar11;
        pFVar10 = *(Fts3Expr **)((long)__s + uVar4 * 8);
        pFVar8->pLeft = pFVar10;
        pFVar10->pParent = pFVar8;
        pFVar11->pParent = pFVar8;
        pFVar5 = pFVar8->pParent;
        pFVar7 = pFVar8;
      }
      pFVar7->pParent = (Fts3Expr *)0x0;
    }
    pFVar8 = pFVar5;
    pFVar11 = pFVar7;
  }
LAB_001a5b08:
  sqlite3_free(__s);
LAB_001a5b10:
  if (iVar2 == 0) {
LAB_001a5b21:
    iVar2 = 0;
    goto LAB_001a5b23;
  }
LAB_001a5b14:
  sqlite3Fts3ExprFree(pFVar11);
  pFVar11 = (Fts3Expr *)0x0;
LAB_001a5b23:
  *pp = pFVar11;
  return iVar2;
}

Assistant:

static int fts3ExprBalance(Fts3Expr **pp, int nMaxDepth){
  int rc = SQLITE_OK;             /* Return code */
  Fts3Expr *pRoot = *pp;          /* Initial root node */
  Fts3Expr *pFree = 0;            /* List of free nodes. Linked by pParent. */
  int eType = pRoot->eType;       /* Type of node in this tree */

  if( nMaxDepth==0 ){
    rc = SQLITE_ERROR;
  }

  if( rc==SQLITE_OK ){
    if( (eType==FTSQUERY_AND || eType==FTSQUERY_OR) ){
      Fts3Expr **apLeaf;
      apLeaf = (Fts3Expr **)sqlite3_malloc64(sizeof(Fts3Expr *) * nMaxDepth);
      if( 0==apLeaf ){
        rc = SQLITE_NOMEM;
      }else{
        memset(apLeaf, 0, sizeof(Fts3Expr *) * nMaxDepth);
      }

      if( rc==SQLITE_OK ){
        int i;
        Fts3Expr *p;

        /* Set $p to point to the left-most leaf in the tree of eType nodes. */
        for(p=pRoot; p->eType==eType; p=p->pLeft){
          assert( p->pParent==0 || p->pParent->pLeft==p );
          assert( p->pLeft && p->pRight );
        }

        /* This loop runs once for each leaf in the tree of eType nodes. */
        while( 1 ){
          int iLvl;
          Fts3Expr *pParent = p->pParent;     /* Current parent of p */

          assert( pParent==0 || pParent->pLeft==p );
          p->pParent = 0;
          if( pParent ){
            pParent->pLeft = 0;
          }else{
            pRoot = 0;
          }
          rc = fts3ExprBalance(&p, nMaxDepth-1);
          if( rc!=SQLITE_OK ) break;

          for(iLvl=0; p && iLvl<nMaxDepth; iLvl++){
            if( apLeaf[iLvl]==0 ){
              apLeaf[iLvl] = p;
              p = 0;
            }else{
              assert( pFree );
              pFree->pLeft = apLeaf[iLvl];
              pFree->pRight = p;
              pFree->pLeft->pParent = pFree;
              pFree->pRight->pParent = pFree;

              p = pFree;
              pFree = pFree->pParent;
              p->pParent = 0;
              apLeaf[iLvl] = 0;
            }
          }
          if( p ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_TOOBIG;
            break;
          }

          /* If that was the last leaf node, break out of the loop */
          if( pParent==0 ) break;

          /* Set $p to point to the next leaf in the tree of eType nodes */
          for(p=pParent->pRight; p->eType==eType; p=p->pLeft);

          /* Remove pParent from the original tree. */
          assert( pParent->pParent==0 || pParent->pParent->pLeft==pParent );
          pParent->pRight->pParent = pParent->pParent;
          if( pParent->pParent ){
            pParent->pParent->pLeft = pParent->pRight;
          }else{
            assert( pParent==pRoot );
            pRoot = pParent->pRight;
          }

          /* Link pParent into the free node list. It will be used as an
          ** internal node of the new tree.  */
          pParent->pParent = pFree;
          pFree = pParent;
        }

        if( rc==SQLITE_OK ){
          p = 0;
          for(i=0; i<nMaxDepth; i++){
            if( apLeaf[i] ){
              if( p==0 ){
                p = apLeaf[i];
                p->pParent = 0;
              }else{
                assert( pFree!=0 );
                pFree->pRight = p;
                pFree->pLeft = apLeaf[i];
                pFree->pLeft->pParent = pFree;
                pFree->pRight->pParent = pFree;

                p = pFree;
                pFree = pFree->pParent;
                p->pParent = 0;
              }
            }
          }
          pRoot = p;
        }else{
          /* An error occurred. Delete the contents of the apLeaf[] array 
          ** and pFree list. Everything else is cleaned up by the call to
          ** sqlite3Fts3ExprFree(pRoot) below.  */
          Fts3Expr *pDel;
          for(i=0; i<nMaxDepth; i++){
            sqlite3Fts3ExprFree(apLeaf[i]);
          }
          while( (pDel=pFree)!=0 ){
            pFree = pDel->pParent;
            sqlite3_free(pDel);
          }
        }

        assert( pFree==0 );
        sqlite3_free( apLeaf );
      }
    }else if( eType==FTSQUERY_NOT ){
      Fts3Expr *pLeft = pRoot->pLeft;
      Fts3Expr *pRight = pRoot->pRight;

      pRoot->pLeft = 0;
      pRoot->pRight = 0;
      pLeft->pParent = 0;
      pRight->pParent = 0;

      rc = fts3ExprBalance(&pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprBalance(&pRight, nMaxDepth-1);
      }

      if( rc!=SQLITE_OK ){
        sqlite3Fts3ExprFree(pRight);
        sqlite3Fts3ExprFree(pLeft);
      }else{
        assert( pLeft && pRight );
        pRoot->pLeft = pLeft;
        pLeft->pParent = pRoot;
        pRoot->pRight = pRight;
        pRight->pParent = pRoot;
      }
    }
  }
  
  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(pRoot);
    pRoot = 0;
  }
  *pp = pRoot;
  return rc;
}